

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deMemPool.c
# Opt level: O3

deMemPool * deMemPool_createRoot(deMemPoolUtil *util,deUint32 flags)

{
  deMemPoolAllocFailFunc p_Var1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  deMemPool *pool;
  
  puVar2 = (undefined8 *)deMalloc(0x90);
  if (puVar2 != (undefined8 *)0x0) {
    puVar2[1] = 0;
    *puVar2 = 0x4000000080;
    puVar2[4] = 0;
    puVar2[5] = 0;
    pool = (deMemPool *)(puVar2 + 2);
    *(undefined8 *)pool = 0;
    puVar2[3] = 0;
    puVar2[6] = 0;
    puVar2[7] = 0;
    puVar2[8] = 0;
    puVar2[9] = puVar2;
    puVar2[3] = 0;
    puVar2[4] = 0;
    if (pool == (deMemPool *)0x0) {
      return (deMemPool *)0x0;
    }
    if (util == (deMemPoolUtil *)0x0) {
      return pool;
    }
    puVar3 = (undefined8 *)deMemPool_alloc(pool,0x10);
    if (puVar3 != (undefined8 *)0x0) {
      p_Var1 = util->allocFailCallback;
      *puVar3 = util->userPointer;
      puVar3[1] = p_Var1;
      puVar2[4] = puVar3;
      return pool;
    }
    deMemPool_destroy(pool);
  }
  return (deMemPool *)0x0;
}

Assistant:

deMemPool* deMemPool_createRoot	(const deMemPoolUtil* util, deUint32 flags)
{
	deMemPool* pool = createPoolInternal(DE_NULL);
	if (!pool)
		return DE_NULL;
#if defined(DE_SUPPORT_FAILING_POOL_ALLOC)
	if (flags & DE_MEMPOOL_ENABLE_FAILING_ALLOCS)
		pool->allowFailing = DE_TRUE;
#endif
#if defined(DE_SUPPORT_DEBUG_POOLS)
	if (flags & DE_MEMPOOL_ENABLE_DEBUG_ALLOCS)
	{
		pool->enableDebugAllocs		= DE_TRUE;
		pool->debugAllocListHead	= DE_NULL;
	}
#endif
	DE_UNREF(flags); /* in case no debug features enabled */

	/* Get copy of utilities. */
	if (util)
	{
		deMemPoolUtil* utilCopy = DE_POOL_NEW(pool, deMemPoolUtil);
		DE_ASSERT(util->allocFailCallback);
		if (!utilCopy)
		{
			deMemPool_destroy(pool);
			return DE_NULL;
		}

		memcpy(utilCopy, util, sizeof(deMemPoolUtil));
		pool->util = utilCopy;
	}

	return pool;
}